

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_> * __thiscall
pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
def<std::shared_ptr<kratos::FSMState>(kratos::FSM::*)(std::__cxx11::string_const&),pybind11::return_value_policy>
          (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *this,char *name_,
          offset_in_Var_to_subr *f,return_value_policy *extra)

{
  offset_in_Var_to_subr f_00;
  name *extra_00;
  handle local_60;
  is_method local_58;
  sibling local_50;
  object local_48;
  cpp_function local_40;
  cpp_function cf;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_50.value.m_ptr = *(handle *)this;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_58.class_.m_ptr = (handle)(handle)name_;
  getattr((pybind11 *)&cf,local_50.value,name_,(PyObject *)&_Py_NoneStruct);
  local_60.m_ptr = (PyObject *)cf.super_function.super_object.super_handle.m_ptr;
  cpp_function::
  cpp_function<std::shared_ptr<kratos::FSMState>,kratos::FSM,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>
            (&local_40,f_00,extra_00,&local_58,&local_50,(return_value_policy *)&local_60);
  object::~object((object *)&cf);
  object::~object(&local_48);
  pybind11::detail::add_class_method((object *)this,name_,&local_40);
  object::~object((object *)&local_40);
  return (class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }